

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_strip_channel(png_row_infop row_info,png_bytep row,int at_start)

{
  png_bytep ppVar1;
  png_bytep ppVar2;
  png_bytep ep;
  png_bytep dp;
  png_bytep sp;
  int at_start_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  ppVar1 = row + row_info->rowbytes;
  ep = row;
  if (row_info->channels == '\x02') {
    if (row_info->bit_depth == '\b') {
      if (at_start == 0) {
        dp = row + 2;
        ep = row + 1;
      }
      else {
        dp = row + 1;
      }
      for (; dp < ppVar1; dp = dp + 2) {
        *ep = *dp;
        ep = ep + 1;
      }
      row_info->pixel_depth = '\b';
    }
    else {
      if (row_info->bit_depth != '\x10') {
        return;
      }
      if (at_start == 0) {
        dp = row + 4;
        ep = row + 2;
      }
      else {
        dp = row + 2;
      }
      for (; dp < ppVar1; dp = dp + 4) {
        ppVar2 = ep + 1;
        *ep = *dp;
        ep = ep + 2;
        *ppVar2 = dp[1];
      }
      row_info->pixel_depth = '\x10';
    }
    row_info->channels = '\x01';
    if (row_info->color_type == '\x04') {
      row_info->color_type = '\0';
    }
  }
  else {
    if (row_info->channels != '\x04') {
      return;
    }
    if (row_info->bit_depth == '\b') {
      if (at_start == 0) {
        dp = row + 4;
        ep = row + 3;
      }
      else {
        dp = row + 1;
      }
      for (; dp < ppVar1; dp = dp + 4) {
        *ep = *dp;
        ppVar2 = ep + 2;
        ep[1] = dp[1];
        ep = ep + 3;
        *ppVar2 = dp[2];
      }
      row_info->pixel_depth = '\x18';
    }
    else {
      if (row_info->bit_depth != '\x10') {
        return;
      }
      if (at_start == 0) {
        dp = row + 8;
        ep = row + 6;
      }
      else {
        dp = row + 2;
      }
      for (; dp < ppVar1; dp = dp + 8) {
        *ep = *dp;
        ep[1] = dp[1];
        ep[2] = dp[2];
        ep[3] = dp[3];
        ppVar2 = ep + 5;
        ep[4] = dp[4];
        ep = ep + 6;
        *ppVar2 = dp[5];
      }
      row_info->pixel_depth = '0';
    }
    row_info->channels = '\x03';
    if (row_info->color_type == '\x06') {
      row_info->color_type = '\x02';
    }
  }
  row_info->rowbytes = (long)ep - (long)row;
  return;
}

Assistant:

void /* PRIVATE */
png_do_strip_channel(png_row_infop row_info, png_bytep row, int at_start)
{
   png_bytep sp = row; /* source pointer */
   png_bytep dp = row; /* destination pointer */
   png_bytep ep = row + row_info->rowbytes; /* One beyond end of row */

   /* At the start sp will point to the first byte to copy and dp to where
    * it is copied to.  ep always points just beyond the end of the row, so
    * the loop simply copies (channels-1) channels until sp reaches ep.
    *
    * at_start:        0 -- convert AG, XG, ARGB, XRGB, AAGG, XXGG, etc.
    *            nonzero -- convert GA, GX, RGBA, RGBX, GGAA, RRGGBBXX, etc.
    */

   /* GA, GX, XG cases */
   if (row_info->channels == 2)
   {
      if (row_info->bit_depth == 8)
      {
         if (at_start != 0) /* Skip initial filler */
            ++sp;
         else          /* Skip initial channel and, for sp, the filler */
         {
            sp += 2; ++dp;
         }

         /* For a 1 pixel wide image there is nothing to do */
         while (sp < ep)
         {
            *dp++ = *sp; sp += 2;
         }

         row_info->pixel_depth = 8;
      }

      else if (row_info->bit_depth == 16)
      {
         if (at_start != 0) /* Skip initial filler */
            sp += 2;
         else          /* Skip initial channel and, for sp, the filler */
         {
            sp += 4; dp += 2;
         }

         while (sp < ep)
         {
            *dp++ = *sp++; *dp++ = *sp; sp += 3;
         }

         row_info->pixel_depth = 16;
      }

      else
         return; /* bad bit depth */

      row_info->channels = 1;

      /* Finally fix the color type if it records an alpha channel */
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
         row_info->color_type = PNG_COLOR_TYPE_GRAY;
   }

   /* RGBA, RGBX, XRGB cases */
   else if (row_info->channels == 4)
   {
      if (row_info->bit_depth == 8)
      {
         if (at_start != 0) /* Skip initial filler */
            ++sp;
         else          /* Skip initial channels and, for sp, the filler */
         {
            sp += 4; dp += 3;
         }

         /* Note that the loop adds 3 to dp and 4 to sp each time. */
         while (sp < ep)
         {
            *dp++ = *sp++; *dp++ = *sp++; *dp++ = *sp; sp += 2;
         }

         row_info->pixel_depth = 24;
      }

      else if (row_info->bit_depth == 16)
      {
         if (at_start != 0) /* Skip initial filler */
            sp += 2;
         else          /* Skip initial channels and, for sp, the filler */
         {
            sp += 8; dp += 6;
         }

         while (sp < ep)
         {
            /* Copy 6 bytes, skip 2 */
            *dp++ = *sp++; *dp++ = *sp++;
            *dp++ = *sp++; *dp++ = *sp++;
            *dp++ = *sp++; *dp++ = *sp; sp += 3;
         }

         row_info->pixel_depth = 48;
      }

      else
         return; /* bad bit depth */

      row_info->channels = 3;

      /* Finally fix the color type if it records an alpha channel */
      if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         row_info->color_type = PNG_COLOR_TYPE_RGB;
   }

   else
      return; /* The filler channel has gone already */

   /* Fix the rowbytes value. */
   row_info->rowbytes = (size_t)(dp-row);
}